

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void Mean16x4_SSE2(uint8_t *ref,uint32_t *dc)

{
  uint uVar1;
  uint uVar3;
  uint uVar4;
  undefined1 auVar2 [16];
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar12;
  int iVar15;
  int iVar18;
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined1 auVar13 [12];
  undefined1 auVar14 [16];
  undefined1 auVar16 [12];
  undefined1 auVar17 [16];
  undefined1 auVar19 [12];
  undefined1 auVar20 [16];
  
  auVar6 = *(undefined1 (*) [16])ref;
  auVar7 = *(undefined1 (*) [16])(ref + 0x20);
  auVar8 = *(undefined1 (*) [16])(ref + 0x40);
  auVar2 = *(undefined1 (*) [16])(ref + 0x60);
  iVar9 = CONCAT22(auVar6._2_2_ >> 8,auVar6._0_2_ >> 8);
  auVar10._0_8_ = CONCAT26(auVar6._6_2_ >> 8,CONCAT24(auVar6._4_2_ >> 8,iVar9));
  auVar10._8_2_ = auVar6._8_2_ >> 8;
  auVar10._10_2_ = auVar6._10_2_ >> 8;
  auVar11._12_2_ = auVar6._12_2_ >> 8;
  auVar11._0_12_ = auVar10;
  auVar11._14_2_ = auVar6._14_2_ >> 8;
  iVar12 = CONCAT22(auVar7._2_2_ >> 8,auVar7._0_2_ >> 8);
  auVar13._0_8_ = CONCAT26(auVar7._6_2_ >> 8,CONCAT24(auVar7._4_2_ >> 8,iVar12));
  auVar13._8_2_ = auVar7._8_2_ >> 8;
  auVar13._10_2_ = auVar7._10_2_ >> 8;
  auVar14._12_2_ = auVar7._12_2_ >> 8;
  auVar14._0_12_ = auVar13;
  auVar14._14_2_ = auVar7._14_2_ >> 8;
  iVar15 = CONCAT22(auVar8._2_2_ >> 8,auVar8._0_2_ >> 8);
  auVar16._0_8_ = CONCAT26(auVar8._6_2_ >> 8,CONCAT24(auVar8._4_2_ >> 8,iVar15));
  auVar16._8_2_ = auVar8._8_2_ >> 8;
  auVar16._10_2_ = auVar8._10_2_ >> 8;
  auVar17._12_2_ = auVar8._12_2_ >> 8;
  auVar17._0_12_ = auVar16;
  auVar17._14_2_ = auVar8._14_2_ >> 8;
  iVar18 = CONCAT22(auVar2._2_2_ >> 8,auVar2._0_2_ >> 8);
  auVar19._0_8_ = CONCAT26(auVar2._6_2_ >> 8,CONCAT24(auVar2._4_2_ >> 8,iVar18));
  auVar19._8_2_ = auVar2._8_2_ >> 8;
  auVar19._10_2_ = auVar2._10_2_ >> 8;
  auVar20._12_2_ = auVar2._12_2_ >> 8;
  auVar20._0_12_ = auVar19;
  auVar20._14_2_ = auVar2._14_2_ >> 8;
  auVar6 = auVar6 & _DAT_001a90c0;
  auVar7 = auVar7 & _DAT_001a90c0;
  auVar8 = auVar8 & _DAT_001a90c0;
  auVar2 = auVar2 & _DAT_001a90c0;
  uVar1 = auVar2._0_4_ + auVar8._0_4_ + iVar15 + auVar7._0_4_ + iVar12 + auVar6._0_4_ + iVar9 +
          iVar18;
  uVar3 = auVar2._4_4_ + auVar8._4_4_ + (int)((ulong)auVar16._0_8_ >> 0x20) +
          auVar7._4_4_ + (int)((ulong)auVar13._0_8_ >> 0x20) +
          auVar6._4_4_ + (int)((ulong)auVar10._0_8_ >> 0x20) + (int)((ulong)auVar19._0_8_ >> 0x20);
  uVar4 = auVar2._8_4_ + auVar8._8_4_ + auVar16._8_4_ +
          auVar7._8_4_ + auVar13._8_4_ + auVar6._8_4_ + auVar10._8_4_ + auVar19._8_4_;
  uVar5 = auVar2._12_4_ + auVar8._12_4_ + auVar17._12_4_ +
          auVar7._12_4_ + auVar14._12_4_ + auVar6._12_4_ + auVar11._12_4_ + auVar20._12_4_;
  *dc = (uVar1 >> 0x10) + (uVar1 & 0xffff);
  dc[1] = (uVar3 >> 0x10) + (uVar3 & 0xffff);
  dc[2] = (uVar4 >> 0x10) + (uVar4 & 0xffff);
  dc[3] = (uVar5 >> 0x10) + (uVar5 & 0xffff);
  return;
}

Assistant:

static void Mean16x4_SSE2(const uint8_t* WEBP_RESTRICT ref, uint32_t dc[4]) {
  const __m128i mask = _mm_set1_epi16(0x00ff);
  const __m128i a0 = _mm_loadu_si128((const __m128i*)&ref[BPS * 0]);
  const __m128i a1 = _mm_loadu_si128((const __m128i*)&ref[BPS * 1]);
  const __m128i a2 = _mm_loadu_si128((const __m128i*)&ref[BPS * 2]);
  const __m128i a3 = _mm_loadu_si128((const __m128i*)&ref[BPS * 3]);
  const __m128i b0 = _mm_srli_epi16(a0, 8);     // hi byte
  const __m128i b1 = _mm_srli_epi16(a1, 8);
  const __m128i b2 = _mm_srli_epi16(a2, 8);
  const __m128i b3 = _mm_srli_epi16(a3, 8);
  const __m128i c0 = _mm_and_si128(a0, mask);   // lo byte
  const __m128i c1 = _mm_and_si128(a1, mask);
  const __m128i c2 = _mm_and_si128(a2, mask);
  const __m128i c3 = _mm_and_si128(a3, mask);
  const __m128i d0 = _mm_add_epi32(b0, c0);
  const __m128i d1 = _mm_add_epi32(b1, c1);
  const __m128i d2 = _mm_add_epi32(b2, c2);
  const __m128i d3 = _mm_add_epi32(b3, c3);
  const __m128i e0 = _mm_add_epi32(d0, d1);
  const __m128i e1 = _mm_add_epi32(d2, d3);
  const __m128i f0 = _mm_add_epi32(e0, e1);
  uint16_t tmp[8];
  _mm_storeu_si128((__m128i*)tmp, f0);
  dc[0] = tmp[0] + tmp[1];
  dc[1] = tmp[2] + tmp[3];
  dc[2] = tmp[4] + tmp[5];
  dc[3] = tmp[6] + tmp[7];
}